

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ConstantValue::getSlice
          (ConstantValue *__return_storage_ptr__,ConstantValue *this,int32_t upper,int32_t lower,
          ConstantValue *defaultValue)

{
  bool bVar1;
  int iVar2;
  SVInt *pSVar3;
  reference pCVar4;
  Queue *this_00;
  ulong uVar5;
  size_type sVar6;
  const_reference __x;
  string *psVar7;
  char *pcVar8;
  SVInt local_100;
  int32_t local_ec;
  undefined1 local_e8 [4];
  int32_t i_1;
  SVQueue result_1;
  SVQueue *q;
  ConstantValue *pCStack_80;
  int32_t i;
  ConstantValue *dest;
  undefined1 local_70 [8];
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> result;
  span<const_slang::ConstantValue,_18446744073709551615UL> elems;
  SVInt local_38;
  ConstantValue *local_28;
  ConstantValue *defaultValue_local;
  int32_t lower_local;
  int32_t upper_local;
  ConstantValue *this_local;
  
  local_28 = defaultValue;
  defaultValue_local._0_4_ = lower;
  defaultValue_local._4_4_ = upper;
  _lower_local = this;
  this_local = __return_storage_ptr__;
  bVar1 = isInteger(this);
  if (bVar1) {
    pSVar3 = integer(this);
    SVInt::slice(&local_38,(int32_t)pSVar3,defaultValue_local._4_4_);
    ConstantValue(__return_storage_ptr__,&local_38);
    SVInt::~SVInt(&local_38);
  }
  else {
    bVar1 = isUnpacked(this);
    if (bVar1) {
      join_0x00000010_0x00000000_ = elements(this);
      iVar2 = defaultValue_local._4_4_ - (int32_t)defaultValue_local;
      std::allocator<slang::ConstantValue>::allocator
                ((allocator<slang::ConstantValue> *)((long)&dest + 7));
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_70,
                 (long)(iVar2 + 1),(allocator<slang::ConstantValue> *)((long)&dest + 7));
      std::allocator<slang::ConstantValue>::~allocator
                ((allocator<slang::ConstantValue> *)((long)&dest + 7));
      pCStack_80 = std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::data
                             ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *
                              )local_70);
      for (q._4_4_ = (int32_t)defaultValue_local; q._4_4_ <= defaultValue_local._4_4_;
          q._4_4_ = q._4_4_ + 1) {
        if (q._4_4_ < 0) {
LAB_001f9dac:
          operator=(pCStack_80,local_28);
        }
        else {
          sVar6 = nonstd::span_lite::span<const_slang::ConstantValue,_18446744073709551615UL>::size
                            ((span<const_slang::ConstantValue,_18446744073709551615UL> *)
                             &result.
                              super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar6 <= (ulong)(long)q._4_4_) goto LAB_001f9dac;
          pCVar4 = nonstd::span_lite::span<const_slang::ConstantValue,_18446744073709551615UL>::
                   operator[]((span<const_slang::ConstantValue,_18446744073709551615UL> *)
                              &result.
                               super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)q._4_4_);
          operator=(pCStack_80,pCVar4);
        }
        pCStack_80 = pCStack_80 + 1;
      }
      ConstantValue(__return_storage_ptr__,(Elements *)local_70);
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_70);
    }
    else {
      bVar1 = isQueue(this);
      if (bVar1) {
        this_00 = queue(this);
        result_1._80_8_ = CopyPtr<slang::SVQueue>::operator*(this_00);
        SVQueue::SVQueue((SVQueue *)local_e8);
        for (local_ec = (int32_t)defaultValue_local; local_ec <= defaultValue_local._4_4_;
            local_ec = local_ec + 1) {
          if (-1 < local_ec) {
            uVar5 = (ulong)local_ec;
            sVar6 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                              ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *
                               )result_1._80_8_);
            if (uVar5 < sVar6) {
              __x = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
                    operator[]((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *
                               )result_1._80_8_,(long)local_ec);
              std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::push_back
                        ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                         local_e8,__x);
            }
          }
        }
        ConstantValue(__return_storage_ptr__,(SVQueue *)local_e8);
        SVQueue::~SVQueue((SVQueue *)local_e8);
      }
      else {
        bVar1 = isString(this);
        if (bVar1) {
          if (defaultValue_local._4_4_ != (int32_t)defaultValue_local) {
            assert::assertFailed
                      ("upper == lower",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/ConstantValue.cpp"
                       ,0xe0,
                       "ConstantValue slang::ConstantValue::getSlice(int32_t, int32_t, const ConstantValue &) const"
                      );
          }
          if (defaultValue_local._4_4_ < 0) {
            assert::assertFailed
                      ("upper >= 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/ConstantValue.cpp"
                       ,0xe1,
                       "ConstantValue slang::ConstantValue::getSlice(int32_t, int32_t, const ConstantValue &) const"
                      );
          }
          psVar7 = str_abi_cxx11_(this);
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psVar7);
          SVInt::SVInt(&local_100,8,(long)*pcVar8,false);
          ConstantValue(__return_storage_ptr__,&local_100);
          SVInt::~SVInt(&local_100);
        }
        else {
          ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ConstantValue::getSlice(int32_t upper, int32_t lower,
                                      const ConstantValue& defaultValue) const {
    if (isInteger())
        return integer().slice(upper, lower);

    if (isUnpacked()) {
        span<const ConstantValue> elems = elements();
        std::vector<ConstantValue> result{size_t(upper - lower + 1)};
        ConstantValue* dest = result.data();

        for (int32_t i = lower; i <= upper; i++) {
            if (i < 0 || size_t(i) >= elems.size())
                *dest++ = defaultValue;
            else
                *dest++ = elems[size_t(i)];
        }

        return result;
    }

    if (isQueue()) {
        auto& q = *queue();
        SVQueue result;
        for (int32_t i = lower; i <= upper; i++) {
            if (i >= 0 && size_t(i) < q.size())
                result.push_back(q[size_t(i)]);
        }

        return result;
    }

    if (isString()) {
        ASSERT(upper == lower);
        ASSERT(upper >= 0);
        return SVInt(8, (uint64_t)str()[size_t(upper)], false);
    }

    return nullptr;
}